

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O0

ValueEntry * __thiscall
de::Random::
chooseWeighted<rsg::ValueEntry_const*,__gnu_cxx::__normal_iterator<rsg::ValueEntry_const**,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
          (Random *this,
          __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
          first,__normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                last,__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> weight)

{
  bool bVar1;
  reference pfVar2;
  reference ppVVar3;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_80;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> local_78;
  float local_6c;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  _Stack_68;
  float w;
  float local_5c;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  _Stack_58;
  float curWeight;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  lastNonZero;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> _Stack_48;
  float p;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_40;
  int local_38;
  float local_34;
  int ndx;
  float weightSum;
  Random *this_local;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> weight_local;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  last_local;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  first_local;
  
  local_34 = 0.0;
  local_38 = 0;
  _ndx = this;
  this_local = (Random *)weight._M_current;
  weight_local._M_current = (float *)last._M_current;
  last_local._M_current = first._M_current;
  while( true ) {
    local_40 = __gnu_cxx::
               __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
               ::operator+(&last_local,(long)local_38);
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                        *)&weight_local);
    if (!bVar1) break;
    _Stack_48 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
                operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *
                          )&this_local,(long)local_38);
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&stack0xffffffffffffffb8);
    local_34 = *pfVar2 + local_34;
    local_38 = local_38 + 1;
  }
  lastNonZero._M_current._4_4_ = getFloat(this,0.0,local_34);
  _Stack_58._M_current = (ValueEntry **)weight_local._M_current;
  local_5c = 0.0;
  local_38 = 0;
  while( true ) {
    _Stack_68 = __gnu_cxx::
                __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                ::operator+(&last_local,(long)local_38);
    bVar1 = __gnu_cxx::operator!=
                      (&stack0xffffffffffffff98,
                       (__normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                        *)&weight_local);
    if (!bVar1) {
      ppVVar3 = __gnu_cxx::
                __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                ::operator*(&stack0xffffffffffffffa8);
      return *ppVVar3;
    }
    local_78 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
               operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                         &this_local,(long)local_38);
    pfVar2 = __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
             operator*(&local_78);
    local_6c = *pfVar2;
    local_5c = local_6c + local_5c;
    if (lastNonZero._M_current._4_4_ < local_5c) break;
    if (0.0 < local_6c) {
      _Stack_58 = __gnu_cxx::
                  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                  ::operator+(&last_local,(long)local_38);
    }
    local_38 = local_38 + 1;
  }
  local_80 = __gnu_cxx::
             __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
             ::operator+(&last_local,(long)local_38);
  ppVVar3 = __gnu_cxx::
            __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
            ::operator*(&local_80);
  return *ppVVar3;
}

Assistant:

T Random::chooseWeighted (InputIter first, InputIter last, WeightIter weight)
{
	// Compute weight sum
	float	weightSum	= 0.0f;
	int		ndx;
	for (ndx = 0; (first + ndx) != last; ndx++)
		weightSum += *(weight + ndx);

	// Random point in 0..weightSum
	float p = getFloat(0.0f, weightSum);

	// Find item in range
	InputIter	lastNonZero	= last;
	float		curWeight	= 0.0f;
	for (ndx = 0; (first + ndx) != last; ndx++)
	{
		float w = *(weight + ndx);

		curWeight += w;

		if (p < curWeight)
			return *(first + ndx);
		else if (w > 0.0f)
			lastNonZero = first + ndx;
	}

	DE_ASSERT(lastNonZero != last);
	return *lastNonZero;
}